

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypt.c
# Opt level: O2

void gen_e(uchar *e)

{
  byte *pbVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  byte bVar5;
  long lVar6;
  uchar val [64];
  uint16_t ind [128];
  uint16_t ind_ [128];
  
  do {
    do {
      randombytes((uchar *)ind_,0x100);
      for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 1) {
        pbVar1 = (byte *)((long)ind_ + lVar3 * 2 + 1);
        *pbVar1 = *pbVar1 & 0xf;
      }
      iVar4 = 0;
      for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 1) {
        if (ind_[lVar3] < 0xda0) {
          lVar6 = (long)iVar4;
          iVar4 = iVar4 + 1;
          ind[lVar6] = ind_[lVar3];
        }
      }
    } while (iVar4 < 0x40);
    bVar2 = false;
    for (lVar3 = 1; lVar3 != 0x40; lVar3 = lVar3 + 1) {
      for (lVar6 = 0; lVar3 != lVar6; lVar6 = lVar6 + 1) {
        if (ind[lVar3] == ind[lVar6]) {
          bVar2 = true;
        }
      }
    }
  } while (bVar2);
  for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 1) {
    val[lVar3] = '\x01' << ((byte)ind[lVar3] & 7);
  }
  for (lVar3 = 0; lVar3 != 0x1b4; lVar3 = lVar3 + 1) {
    bVar5 = 0;
    for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 1) {
      bVar5 = (byte)((int)((((uint)(ind[lVar6] >> 3) ^ (uint)lVar3) & 0xffff) - 1) >> 0x1f) &
              val[lVar6] | bVar5;
    }
    e[lVar3] = bVar5;
  }
  return;
}

Assistant:

void gen_e(unsigned char *e)
{
	int i, j, eq, count;

	uint16_t ind_[ SYS_T*2 ];
	uint16_t ind[ SYS_T*2 ];
	unsigned char mask;	
	unsigned char val[ SYS_T ];	

	while (1)
	{
		randombytes((unsigned char *) ind_, sizeof(ind_));

		for (i = 0; i < SYS_T*2; i++)
			ind_[i] &= GFMASK;

		// moving and counting indices in the correct range

		count = 0;
		for (i = 0; i < SYS_T*2; i++)
			if (ind_[i] < SYS_N)
				ind[ count++ ] = ind_[i];
		
		if (count < SYS_T) continue;

		// check for repetition

		eq = 0;

		for (i = 1; i < SYS_T; i++) for (j = 0; j < i; j++)
			if (ind[i] == ind[j]) 
				eq = 1;

		if (eq == 0)
			break;
	}

	for (j = 0; j < SYS_T; j++)
		val[j] = 1 << (ind[j] & 7);

	for (i = 0; i < SYS_N/8; i++) 
	{
		e[i] = 0;

		for (j = 0; j < SYS_T; j++)
		{
			mask = same_mask(i, (ind[j] >> 3));

			e[i] |= val[j] & mask;
		}
	}
}